

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

string * __thiscall
cppcms::http::request::http_accept_abi_cxx11_(string *__return_storage_ptr__,request *this)

{
  cppcms::impl::cgi::connection::getenv_abi_cxx11_
            ((connection *)__return_storage_ptr__,(char *)this->conn_);
  return __return_storage_ptr__;
}

Assistant:

std::string request::http_accept() { return conn_->getenv("HTTP_ACCEPT"); }